

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O1

void __thiscall covenant::CFG::get_alphabet_min_and_max(CFG *this,int *min,int *max)

{
  pointer pvVar1;
  bool bVar2;
  pointer pPVar3;
  ulong uVar4;
  int *piVar5;
  int *piVar6;
  ulong uVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  ulong uVar11;
  vector<int,_std::allocator<int>_> terminals;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> RHS;
  int local_7c;
  vector<int,_std::allocator<int>_> local_78;
  int *local_58;
  int *local_50;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_48;
  
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_58 = min;
  local_50 = max;
  if ((this->prods).
      super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->prods).
      super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar7 = 0;
    do {
      pvVar1 = (this->prods).
               super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pPVar3 = pvVar1[uVar7].
               super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar1[uVar7].
                   super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                   ._M_impl.super__Vector_impl_data + 8) != pPVar3) {
        uVar4 = 0;
        uVar11 = 1;
        do {
          std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                    (&local_48,
                     (this->rules).
                     super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + pPVar3[uVar4].rule);
          if (((long)local_48.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_48.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                     _M_impl.super__Vector_impl_data._M_start == 4) &&
             (((local_48.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                super__Vector_impl_data._M_start)->x & 1) == 0)) {
            local_7c = (local_48.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                        _M_impl.super__Vector_impl_data._M_start)->x >> 1;
            if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&local_78,
                         (iterator)
                         local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_7c);
            }
            else {
              *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_7c;
              local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
            }
          }
          if (local_48.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.
                            super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          pvVar1 = (this->prods).
                   super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pPVar3 = pvVar1[uVar7].
                   super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          bVar2 = uVar11 < (ulong)((long)*(pointer *)
                                          ((long)&pvVar1[uVar7].
                                                  super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                   (long)pPVar3 >> 2);
          uVar4 = uVar11;
          uVar11 = (ulong)((int)uVar11 + 1);
        } while (bVar2);
      }
      uVar7 = (ulong)((int)uVar7 + 1);
      uVar4 = ((long)(this->prods).
                     super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->prods).
                     super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar7 <= uVar4 && uVar4 - uVar7 != 0);
  }
  piVar5 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start + 1;
  piVar6 = piVar5;
  piVar10 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  piVar8 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if (piVar5 != local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish &&
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    do {
      piVar9 = piVar6;
      if (*piVar10 <= *piVar6) {
        piVar9 = piVar10;
      }
      piVar6 = piVar6 + 1;
      piVar10 = piVar9;
    } while (piVar6 != local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    *local_58 = *piVar9;
    piVar6 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if (piVar5 != local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish &&
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      do {
        piVar8 = piVar5;
        if (*piVar5 <= *piVar6) {
          piVar8 = piVar6;
        }
        piVar5 = piVar5 + 1;
        piVar6 = piVar8;
      } while (piVar5 != local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
  }
  else {
    *local_58 = *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  }
  *local_50 = *piVar8;
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void get_alphabet_min_and_max(int &min, int &max)
    {
      vector<int> terminals;
      for ( unsigned int vv = 0; vv < prods.size(); vv++ )
      {
        for ( unsigned int ri = 0; ri < prods[vv].size(); ri++ )
        {
          const int r = prods[vv][ri].rule;
          vector<Sym> RHS = rules[r];
          if (RHS.size() == 1 && RHS[0].isTerm())
            terminals.push_back(RHS[0].symID());
        }
      }
      min = *min_element(terminals.begin(), terminals.end());
      max = *max_element(terminals.begin(), terminals.end());
    }